

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProfilerBuffer.cpp
# Opt level: O2

void __thiscall
helics::ProfilerBuffer::setOutputFile(ProfilerBuffer *this,string *fileName,bool append)

{
  char *pcVar1;
  int *piVar2;
  error_code *peVar3;
  ofstream file;
  byte abStack_1f8 [480];
  
  if (fileName->_M_string_length == 0) {
    (this->mFileName)._M_string_length = 0;
    *(this->mFileName)._M_dataplus._M_p = '\0';
  }
  else {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&this->mFileName,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)fileName);
    if (!append) {
      std::ofstream::ofstream((string *)&file);
      std::ofstream::open((string *)&file,(_Ios_Openmode)&this->mFileName);
      if ((abStack_1f8[*(long *)(_file + -0x18)] & 5) != 0) {
        pcVar1 = (char *)__cxa_allocate_exception(0x20);
        piVar2 = __errno_location();
        peVar3 = (error_code *)strerror(*piVar2);
        std::iostream_category();
        std::ios_base::failure[abi:cxx11]::failure(pcVar1,peVar3);
        __cxa_throw(pcVar1,&std::ios_base::failure[abi:cxx11]::typeinfo,
                    std::ios_base::failure[abi:cxx11]::~failure);
      }
      std::ofstream::~ofstream(&file);
    }
  }
  return;
}

Assistant:

void ProfilerBuffer::setOutputFile(std::string fileName, bool append)
{
    if (fileName.empty()) {
        mFileName.clear();
        return;
    }
    mFileName = std::move(fileName);
    if (append) {
        return;
    }

    std::ofstream file;
    // can't enable exception now because of gcc bug that raises ios_base::failure with useless
    // message file.exceptions(file.exceptions() | std::ios::failbit);
    file.open(mFileName, std::ios::out | std::ios::trunc);
    if (file.fail()) {
        throw std::ios_base::failure(std::strerror(errno));
    }
}